

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O0

flag_type __thiscall
stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL>::get
          (stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL> *this)

{
  bool bVar1;
  logger *this_00;
  size_t i;
  uint64_t set_bits;
  flag_type result;
  undefined4 in_stack_fffffffffffffe18;
  log_level in_stack_fffffffffffffe1c;
  logger *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *in_stack_fffffffffffffe30;
  stored_bitfield<5UL,_32UL> *in_stack_fffffffffffffe40;
  logger *in_stack_ffffffffffffff50;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = stored_bitfield<5UL,_32UL>::lower_bits(in_stack_fffffffffffffe40);
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::flags
            ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)in_stack_fffffffffffffe20
             ,(Zero)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  bVar1 = false;
  while (!bVar1) {
    if ((local_18 & 1) != 0) {
      flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::operator|=
                (in_stack_fffffffffffffe30,(enum_type)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      local_18 = local_18 & 0xfffffffffffffffe;
    }
    bVar1 = true;
  }
  if (local_18 != 0) {
    logger::logger(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char (*) [10])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
    ;
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char **)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char (*) [10])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
    ;
    logger::operator<<(in_stack_fffffffffffffe20,
                       (_func_ios_base_ptr_ios_base_ptr *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    this_00 = logger::operator<<(in_stack_fffffffffffffe20,
                                 (unsigned_long *)
                                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::operator<<(this_00,(_func_ios_base_ptr_ios_base_ptr *)
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::~logger(in_stack_ffffffffffffff50);
  }
  return (flag_type)local_8;
}

Assistant:

flag_type get() {
		
		boost::uint64_t set_bits = this->lower_bits();
		flag_type result = 0;
		
		for(size_t i = 0; i < this->size; i++) {
			if(set_bits & (boost::uint64_t(1) << i)) {
				result |= Mapping::values[i];
				set_bits &= ~(boost::uint64_t(1) << i);
			}
		}
		
		if(set_bits) {
			log_warning << "Unexpected " << enum_names<enum_type>::name << " flags: "
			            << std::hex << set_bits << std::dec;
		}
		
		return result;
	}